

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_fixed_suite::fixed_operator_index_const(void)

{
  array<int,_4UL> array;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 auStack_2c [4];
  undefined4 local_1c;
  
  local_38 = 0xb;
  uStack_34 = 0x16;
  uStack_30 = 0x21;
  auStack_2c[0] = 0x2c;
  local_1c = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x392,"void api_fixed_suite::fixed_operator_index_const()",&local_38,&local_1c);
  local_1c = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x393,"void api_fixed_suite::fixed_operator_index_const()",&uStack_34,&local_1c);
  local_1c = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x394,"void api_fixed_suite::fixed_operator_index_const()",&uStack_30,&local_1c);
  local_1c = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x395,"void api_fixed_suite::fixed_operator_index_const()",auStack_2c,&local_1c);
  return;
}

Assistant:

void fixed_operator_index_const()
{
    std::array<int, 4> array = {11, 22, 33, 44};
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), array.size());
    BOOST_TEST_EQ(span[0], 11);
    BOOST_TEST_EQ(span[1], 22);
    BOOST_TEST_EQ(span[2], 33);
    BOOST_TEST_EQ(span[3], 44);
}